

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

void __thiscall icu_63::UVector::setElementAt(UVector *this,int32_t elem,int32_t index)

{
  int32_t index_local;
  int32_t elem_local;
  UVector *this_local;
  
  if ((-1 < index) && (index < this->count)) {
    if ((this->elements[index].pointer != (void *)0x0) && (this->deleter != (UObjectDeleter *)0x0))
    {
      (*this->deleter)(this->elements[index].pointer);
    }
    this->elements[index].pointer = (void *)0x0;
    this->elements[index].integer = elem;
  }
  return;
}

Assistant:

void UVector::setElementAt(int32_t elem, int32_t index) {
    if (0 <= index && index < count) {
        if (elements[index].pointer != 0 && deleter != 0) {
            // TODO:  this should be an error.  mixing up ints and pointers.
            (*deleter)(elements[index].pointer);
        }
        elements[index].pointer = NULL;
        elements[index].integer = elem;
    }
    /* else index out of range */
}